

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

void __thiscall QPDFParser::warn(QPDFParser *this,qpdf_offset_t offset,string *msg)

{
  int iVar1;
  undefined4 extraout_var;
  QPDFExc local_230;
  QPDFExc local_1b0;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string name;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string descr;
  string *msg_local;
  qpdf_offset_t offset_local;
  QPDFParser *this_local;
  
  descr.field_2._8_8_ = msg;
  if (this->stream_id == 0) {
    iVar1 = (*this->input->_vptr_InputSource[3])();
    QPDFExc::QPDFExc(&local_230,qpdf_e_damaged_pdf,(string *)CONCAT44(extraout_var,iVar1),
                     this->object_description,offset,(string *)descr.field_2._8_8_);
    warn(this,&local_230);
    QPDFExc::~QPDFExc(&local_230);
  }
  else {
    s_abi_cxx11_(&local_80,"object ",7);
    std::__cxx11::to_string(&local_a0,this->obj_id);
    std::operator+(&local_60,&local_80,&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60," 0");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    QPDF::getFilename_abi_cxx11_(&local_110,this->context);
    std::operator+(&local_f0,&local_110," object stream ");
    std::__cxx11::to_string(&local_130,this->stream_id);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    QPDFExc::QPDFExc(&local_1b0,qpdf_e_damaged_pdf,(string *)local_d0,(string *)local_40,offset,
                     (string *)descr.field_2._8_8_);
    warn(this,&local_1b0);
    QPDFExc::~QPDFExc(&local_1b0);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void
QPDFParser::warn(qpdf_offset_t offset, std::string const& msg) const
{
    if (stream_id) {
        std::string descr = "object "s + std::to_string(obj_id) + " 0";
        std::string name = context->getFilename() + " object stream " + std::to_string(stream_id);
        warn(QPDFExc(qpdf_e_damaged_pdf, name, descr, offset, msg));
    } else {
        warn(QPDFExc(qpdf_e_damaged_pdf, input.getName(), object_description, offset, msg));
    }
}